

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

char * getVertexName(Abc_Ntk_t *pNtk,int v)

{
  int *piVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Vec_Ptr_t *p;
  
  p = pNtk->vPos;
  piVar1 = &p->nSize;
  if (*piVar1 <= v) {
    p = pNtk->vPis;
    v = v - *piVar1;
  }
  pObj = (Abc_Obj_t *)Vec_PtrEntry(p,v);
  pcVar2 = Abc_ObjName(pObj);
  return pcVar2;
}

Assistant:

static char * 
getVertexName(Abc_Ntk_t *pNtk, int v)
{   
    Abc_Obj_t * pObj;
    int numouts =  Abc_NtkPoNum(pNtk);

    if (v < numouts)    
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos, v);
    else
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis, v - numouts);       
    
    return Abc_ObjName(pObj);
}